

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O1

void __thiscall
Buffer_peek_string_no_len_arg_Test::TestBody(Buffer_peek_string_no_len_arg_Test *this)

{
  char *pcVar1;
  pointer *__ptr;
  AssertionResult gtest_ar;
  bfy_buffer buf;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  AssertHelper local_b0;
  internal local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  bfy_buffer local_98;
  
  bfy_buffer_init();
  bfy_buffer_add_readonly(&local_98,"Lorem ipsum dolor sit amet",0x1a);
  pcVar1 = bfy_buffer_peek_string(&local_98,(size_t *)0x0);
  testing::internal::CmpHelperSTREQ
            (local_a8,"std::data(str1)","bfy_buffer_peek_string(&buf, nullptr)",
             "Lorem ipsum dolor sit amet",pcVar1);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x2f5,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_b8._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  bfy_buffer_destruct(&local_98);
  return;
}

Assistant:

TEST(Buffer, peek_string_no_len_arg) {
    auto buf = bfy_buffer_init();
    bfy_buffer_add_readonly(&buf, std::data(str1), std::size(str1));
    EXPECT_STREQ(std::data(str1), bfy_buffer_peek_string(&buf, nullptr));
    bfy_buffer_destruct(&buf);
}